

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadANIM(B3DImporter *this)

{
  int iVar1;
  tuple<aiAnimation_*,_std::default_delete<aiAnimation>_> this_00;
  float fVar2;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  __uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_> local_20;
  
  ReadInt(this);
  iVar1 = ReadInt(this);
  fVar2 = ReadFloat(this);
  this_00.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>)operator_new(0x448);
  aiAnimation::aiAnimation
            ((aiAnimation *)
             this_00.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
             super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl);
  *(double *)
   ((long)this_00.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x408) = (double)iVar1;
  *(double *)
   ((long)this_00.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x410) = (double)fVar2;
  local_20._M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (tuple<aiAnimation_*,_std::default_delete<aiAnimation>_>)
       (tuple<aiAnimation_*,_std::default_delete<aiAnimation>_>)
       this_00.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
       super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>,std::allocator<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>>
  ::emplace_back<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>
            ((vector<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>,std::allocator<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>>
              *)&this->_animations,
             (unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&local_20);
  std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr
            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&local_20);
  return;
}

Assistant:

void B3DImporter::ReadANIM(){
    /*int flags=*/ReadInt();
    int frames=ReadInt();
    float fps=ReadFloat();

    std::unique_ptr<aiAnimation> anim(new aiAnimation);

    anim->mDuration=frames;
    anim->mTicksPerSecond=fps;
    _animations.emplace_back( std::move(anim) );
}